

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>,std::__cxx11::string>
               (AVisitor<hiberlite::UpdateBean> *ar,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *v,uint param_3)

{
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  body;
  allocator local_109;
  string local_108;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b8;
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_68;
  
  std::__cxx11::string::string((string *)&local_108,"items",&local_109);
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_e8._8_8_ =
       (v->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_e8._0_8_ = v;
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::collection_nvp(&local_68,&local_108,
                   (stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_e8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_108);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::collection_nvp(&local_b8,&local_68);
  AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_b8);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~collection_nvp(&local_b8);
  collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~collection_nvp(&local_68);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}